

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress_block.c
# Opt level: O3

void ZSTD_initFseState(ZSTD_fseState *DStatePtr,BIT_DStream_t *bitD,ZSTD_seqSymbol *dt)

{
  uint uVar1;
  char *pcVar2;
  char *pcVar3;
  uint uVar4;
  size_t *psVar5;
  void *ptr;
  
  uVar4 = bitD->bitsConsumed + dt->baseValue;
  uVar1 = BIT_mask[dt->baseValue];
  bitD->bitsConsumed = uVar4;
  DStatePtr->state = (ulong)((uint)(bitD->bitContainer >> (-(char)uVar4 & 0x3fU)) & uVar1);
  if (uVar4 < 0x41) {
    pcVar2 = bitD->ptr;
    if (pcVar2 < bitD->limitPtr) {
      pcVar3 = bitD->start;
      if (pcVar2 == pcVar3) goto LAB_00754175;
      uVar1 = (int)pcVar2 - (int)pcVar3;
      if (pcVar3 <= pcVar2 + -(ulong)(uVar4 >> 3)) {
        uVar1 = uVar4 >> 3;
      }
      psVar5 = (size_t *)(pcVar2 + -(ulong)uVar1);
      bitD->ptr = (char *)psVar5;
      uVar4 = uVar4 + uVar1 * -8;
    }
    else {
      psVar5 = (size_t *)(pcVar2 + -(ulong)(uVar4 >> 3));
      bitD->ptr = (char *)psVar5;
      uVar4 = uVar4 & 7;
    }
    bitD->bitsConsumed = uVar4;
    bitD->bitContainer = *psVar5;
  }
LAB_00754175:
  DStatePtr->table = dt + 1;
  return;
}

Assistant:

static void
ZSTD_initFseState(ZSTD_fseState* DStatePtr, BIT_DStream_t* bitD, const ZSTD_seqSymbol* dt)
{
    const void* ptr = dt;
    const ZSTD_seqSymbol_header* const DTableH = (const ZSTD_seqSymbol_header*)ptr;
    DStatePtr->state = BIT_readBits(bitD, DTableH->tableLog);
    DEBUGLOG(6, "ZSTD_initFseState : val=%u using %u bits",
                (U32)DStatePtr->state, DTableH->tableLog);
    BIT_reloadDStream(bitD);
    DStatePtr->table = dt + 1;
}